

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fspec.cc
# Opt level: O2

void __thiscall
ParamListStandard::getRangeList(ParamListStandard *this,AddrSpace *spc,RangeList *res)

{
  _List_node_base *p_Var1;
  
  p_Var1 = (_List_node_base *)&this->entry;
  while (p_Var1 = (((_List_base<ParamEntry,_std::allocator<ParamEntry>_> *)&p_Var1->_M_next)->
                  _M_impl)._M_node.super__List_node_base._M_next,
        p_Var1 != (_List_node_base *)&this->entry) {
    if ((AddrSpace *)p_Var1[2]._M_next == spc) {
      RangeList::insertRange
                (res,spc,(uintb)p_Var1[2]._M_prev,
                 (long)p_Var1[2]._M_prev + (long)*(int *)&p_Var1[3]._M_next + -1);
    }
  }
  return;
}

Assistant:

void ParamListStandard::getRangeList(AddrSpace *spc,RangeList &res) const

{
  list<ParamEntry>::const_iterator iter;
  for(iter=entry.begin();iter!=entry.end();++iter) {
    if ((*iter).getSpace() != spc) continue;
    uintb baseoff = (*iter).getBase();
    uintb endoff = baseoff + (*iter).getSize() - 1;
    res.insertRange(spc,baseoff,endoff);
  }
}